

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# border.cpp
# Opt level: O1

void __thiscall ftxui::Border::Border(Border *this,Elements *children)

{
  allocator_type local_31;
  Elements local_30;
  
  local_30.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (children->
       super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  local_30.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (children->
       super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_30.
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (children->
       super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (children->
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (children->
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (children->
  super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Node::Node(&this->super_Node,&local_30);
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::~vector
            (&local_30);
  (this->super_Node)._vptr_Node = (_func_int **)&PTR__Border_00175e30;
  (this->charset_pixel).super__Vector_base<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->charset_pixel).super__Vector_base<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->charset_pixel).super__Vector_base<ftxui::Pixel,_std::allocator<ftxui::Pixel>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  vector<std::__cxx11::string*,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->charset,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             simple_border_charset_abi_cxx11_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)charset_abi_cxx11_
             ,&local_31);
  return;
}

Assistant:

Border(Elements children)
      : Node(std::move(children)),
        charset(std::begin(simple_border_charset),
                std::end(simple_border_charset)) {}